

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmState *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  cmGlobalGenerator *pcVar6;
  int iVar7;
  string fullName;
  allocator local_69;
  string local_68;
  allocator local_41;
  string local_40;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  iVar7 = -2;
  if (this->CurrentWorkingMode == NORMAL_MODE) {
    iVar3 = DoPreConfigureChecks(this);
    if (iVar3 < 0) {
      return -2;
    }
    if (iVar3 == 0) goto LAB_003011fe;
  }
  else {
LAB_003011fe:
    std::__cxx11::string::string((string *)&fullName,"CMAKE_HOME_DIRECTORY",(allocator *)&local_68);
    pcVar4 = GetHomeDirectory(this);
    AddCacheEntry(this,&fullName,pcVar4,
                  "Source directory with the top level CMakeLists.txt file for this project",4);
    std::__cxx11::string::~string((string *)&fullName);
  }
  if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
    pcVar1 = this->State;
    std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_68);
    pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    pcVar1 = this->State;
    std::__cxx11::string::string((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator *)&local_68)
    ;
    pcVar5 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_68,pcVar4,&local_69);
      pcVar4 = "";
      if (pcVar5 != (char *)0x0) {
        pcVar4 = pcVar5;
      }
      std::__cxx11::string::string((string *)&local_40,pcVar4,&local_41);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&fullName,&local_68,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_68);
      pcVar6 = CreateGlobalGenerator(this,&fullName);
      this->GlobalGenerator = pcVar6;
      std::__cxx11::string::~string((string *)&fullName);
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      CreateDefaultGlobalGenerator(this);
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
        return -1;
      }
    }
    else {
      cmSystemTools::s_ForceUnixPaths = this->GlobalGenerator->ForceUnixPaths;
    }
  }
  pcVar1 = this->State;
  std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_68);
  pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (pcVar4 == (char *)0x0) {
LAB_003013ef:
    pcVar1 = this->State;
    std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_68);
    pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_40);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_68);
      AddCacheEntry(this,&fullName,local_68._M_dataplus._M_p,"Name of generator.",4);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&fullName);
      std::__cxx11::string::string
                ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator *)&local_40);
      cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_68,this->GlobalGenerator);
      AddCacheEntry(this,&fullName,local_68._M_dataplus._M_p,
                    "Name of external makefile project generator.",4);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&fullName);
    }
    pcVar1 = this->State;
    std::__cxx11::string::string
              ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator *)&local_68);
    pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator *)&local_68);
      AddCacheEntry(this,&fullName,(this->GeneratorPlatform)._M_dataplus._M_p,
                    "Name of generator platform.",4);
      std::__cxx11::string::~string((string *)&fullName);
    }
    else if ((this->GeneratorPlatform)._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&this->GeneratorPlatform);
    }
    else {
      bVar2 = std::operator!=(&this->GeneratorPlatform,pcVar4);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&fullName,"Error: generator platform: ",(allocator *)&local_68);
        std::__cxx11::string::append((string *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        cmSystemTools::Error(fullName._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        goto LAB_00301738;
      }
    }
    pcVar1 = this->State;
    std::__cxx11::string::string
              ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator *)&local_68);
    pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator *)&local_68);
      AddCacheEntry(this,&fullName,(this->GeneratorToolset)._M_dataplus._M_p,
                    "Name of generator toolset.",4);
      std::__cxx11::string::~string((string *)&fullName);
    }
    else if ((this->GeneratorToolset)._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&this->GeneratorToolset);
    }
    else {
      bVar2 = std::operator!=(&this->GeneratorToolset,pcVar4);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&fullName,"Error: generator toolset: ",(allocator *)&local_68);
        std::__cxx11::string::append((string *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        cmSystemTools::Error(fullName._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        goto LAB_00301738;
      }
    }
    bVar2 = cmState::GetIsInTryCompile(this->State);
    if (!bVar2) {
      cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
      TruncateOutputLog(this,"CMakeOutput.log");
      TruncateOutputLog(this,"CMakeError.log");
    }
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[9])();
    pcVar1 = this->State;
    std::__cxx11::string::string
              ((string *)&fullName,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator *)&local_68);
    pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar4 != (char *)0x0) {
      pcVar1 = this->State;
      std::__cxx11::string::string((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator *)&local_68)
      ;
      pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator *)&local_68);
        AddCacheEntry(this,&fullName,"","Single output directory for building all libraries.",1);
        std::__cxx11::string::~string((string *)&fullName);
      }
      pcVar1 = this->State;
      std::__cxx11::string::string
                ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_68);
      pcVar4 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_68);
        AddCacheEntry(this,&fullName,"","Single output directory for building all executables.",1);
        std::__cxx11::string::~string((string *)&fullName);
      }
    }
    this_00 = *(this->GlobalGenerator->Makefiles).
               super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&fullName,"CTEST_USE_LAUNCHERS",(allocator *)&local_40);
    bVar2 = cmMakefile::IsOn(this_00,&fullName);
    if (bVar2) {
      pcVar1 = this->State;
      std::__cxx11::string::string((string *)&local_68,"RULE_LAUNCH_COMPILE",&local_69);
      pcVar4 = cmState::GetGlobalProperty(pcVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&fullName);
      if (pcVar4 == (char *)0x0) {
        cmSystemTools::Error
                  ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                   ,(char *)0x0,(char *)0x0,(char *)0x0);
      }
    }
    else {
      std::__cxx11::string::~string((string *)&fullName);
    }
    if (this->CurrentWorkingMode == NORMAL_MODE) {
      pcVar4 = GetHomeOutputDirectory(this);
      std::__cxx11::string::string((string *)&fullName,pcVar4,(allocator *)&local_68);
      SaveCache(this,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
    }
    bVar2 = cmSystemTools::GetErrorOccuredFlag();
    iVar7 = -(uint)bVar2;
  }
  else {
    pcVar6 = this->GlobalGenerator;
    std::__cxx11::string::string((string *)&fullName,pcVar4,(allocator *)&local_68);
    iVar3 = (*pcVar6->_vptr_cmGlobalGenerator[4])(pcVar6,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if ((char)iVar3 != '\0') goto LAB_003013ef;
    std::__cxx11::string::string((string *)&fullName,"Error: generator : ",(allocator *)&local_68);
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_68);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    cmSystemTools::Error(fullName._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00301738:
    std::__cxx11::string::~string((string *)&fullName);
  }
  return iVar7;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = 0;
  if (this->GetWorkingMode() == NORMAL_MODE) {
    res = this->DoPreConfigureChecks();
  }
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    const char* genName =
      this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    const char* extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          genName, extraGenName ? extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  const char* genName =
    this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(genName)) {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += genName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR",
                        this->GlobalGenerator->GetName().c_str(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmStateEnums::INTERNAL);
  }

  if (const char* platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatform.empty()) {
      this->GeneratorPlatform = platformName;
    } else if (this->GeneratorPlatform != platformName) {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += platformName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                        this->GeneratorPlatform.c_str(),
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (const char* tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolset.empty()) {
      this->GeneratorToolset = tsName;
    } else if (this->GeneratorToolset != tsName) {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += tsName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                        this->GeneratorToolset.c_str(),
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  cmMakefile* mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  // only save the cache if there were no fatal errors
  if (this->GetWorkingMode() == NORMAL_MODE) {
    this->SaveCache(this->GetHomeOutputDirectory());
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  return 0;
}